

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pParse;
  ExprList *pEVar1;
  SrcList *pSVar2;
  char **ppcVar3;
  long lVar4;
  
  pParse = pWalker->pParse;
  pEVar1 = p->pEList;
  if (pEVar1 != (ExprList *)0x0) {
    ppcVar3 = &pEVar1->a[0].zName;
    for (lVar4 = 0; lVar4 < pEVar1->nExpr; lVar4 = lVar4 + 1) {
      if (*ppcVar3 != (char *)0x0) {
        sqlite3RenameTokenRemap(pParse,(void *)0x0,*ppcVar3);
      }
      ppcVar3 = ppcVar3 + 4;
    }
  }
  pSVar2 = p->pSrc;
  if (pSVar2 != (SrcList *)0x0) {
    ppcVar3 = &pSVar2->a[0].zName;
    for (lVar4 = 0; lVar4 < pSVar2->nSrc; lVar4 = lVar4 + 1) {
      sqlite3RenameTokenRemap(pParse,(void *)0x0,*ppcVar3);
      ppcVar3 = ppcVar3 + 0xe;
    }
  }
  return 0;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zName ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
    }
  }
  return WRC_Continue;
}